

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O2

ALLEGRO_FONT * al_load_ttf_font_stretch(char *filename,int w,int h,int flags)

{
  char cVar1;
  ALLEGRO_FILE *file;
  ALLEGRO_FONT *pAVar2;
  
  file = (ALLEGRO_FILE *)al_fopen(filename,"rb");
  if (file != (ALLEGRO_FILE *)0x0) {
    pAVar2 = al_load_ttf_font_stretch_f(file,filename,w,h,flags);
    return pAVar2;
  }
  cVar1 = _al_trace_prefix("font",3,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                           ,0x3e2,"al_load_ttf_font_stretch");
  if (cVar1 != '\0') {
    _al_trace_suffix("Unable to open file for reading: %s\n",filename);
  }
  return (ALLEGRO_FONT *)0x0;
}

Assistant:

ALLEGRO_FONT *al_load_ttf_font_stretch(char const *filename, int w, int h,
   int flags)
{
   ALLEGRO_FILE *f;
   ALLEGRO_FONT *font;
   ASSERT(filename);

   f = al_fopen(filename, "rb");
   if (!f) {
      ALLEGRO_ERROR("Unable to open file for reading: %s\n", filename);
      return NULL;
   }

   /* The file handle is owned by the function and the file is usually only
    * closed when the font is destroyed, in case Freetype has to load data
    * at a later time.
    */
   font = al_load_ttf_font_stretch_f(f, filename, w, h, flags);

   return font;
}